

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void rtranspose(double *m,int rows,int cols,double *n,int r,int c)

{
  int iVar1;
  double dVar2;
  int block;
  int cm2;
  int rm2;
  int cm1;
  int rm1;
  int cm;
  int rm;
  int j;
  int i;
  int c_local;
  int r_local;
  double *n_local;
  int cols_local;
  int rows_local;
  double *m_local;
  
  if ((rows < 0x41) && (cols < 0x41)) {
    for (rm = 0; rm < rows; rm = rm + 1) {
      for (cm = 0; cm < cols; cm = cm + 1) {
        n[rm + cm * r] = m[cm + rm * c];
      }
    }
  }
  else if (cols < rows) {
    if (cols < rows) {
      dVar2 = ceil((double)rows / 2.0);
      iVar1 = (int)dVar2;
      rtranspose(m,iVar1,cols,n,r,c);
      rtranspose(m + iVar1 * c,rows - iVar1,cols,n + iVar1,r,c);
    }
  }
  else {
    dVar2 = ceil((double)cols / 2.0);
    iVar1 = (int)dVar2;
    rtranspose(m,rows,iVar1,n,r,c);
    rtranspose(m + iVar1,rows,cols - iVar1,n + iVar1 * r,r,c);
  }
  return;
}

Assistant:

void rtranspose(double *m, int rows, int cols,double *n, int r, int c) {
	register int i,j;
	int rm,cm;
	int rm1,cm1,rm2,cm2;
	int block;

	block = (int) BLOCKSIZE;

	if (rows <= block && cols <= block) {
		for (i = 0; i < rows; ++i) {
			for (j = 0; j < cols; ++j) {
				n[i+j*r] = m[j+i*c];
				//cout << *(n+i+j*r) << " ";
			}
		}
		//cout << endl;

	} else if (cols >= rows) {
		rm = rows;
		cm1 = (int) ceil((double) cols/2.0);
		cm2 = cols - cm1;

		rtranspose(m,rm,cm1,n,r,c);
		rtranspose(m+cm1,rm,cm2,n+cm1*r,r,c);
	} else if (rows > cols) {
		rm1 = (int) ceil((double) rows/2.0);
		rm2 = rows - rm1;
		cm = cols;
		rtranspose(m,rm1,cm,n,r,c);
		rtranspose(m+rm1*c,rm2,cm,n+rm1,r,c);
	}

}